

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O0

int going_parse_config(char *path)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  pointer ppVar5;
  iterator local_420;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_418;
  iterator local_410;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_408;
  const_iterator cit;
  stringstream stream;
  undefined1 local_268 [8];
  string word;
  string line;
  fstream infile;
  char *path_local;
  
  going_init_config_keyword_map();
  std::fstream::fstream((void *)((long)&line.field_2 + 8),path,_S_in);
  std::__cxx11::string::string((string *)(word.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_268);
  bVar1 = std::ios::operator!((ios *)((long)&line.field_2 +
                                     *(long *)(line.field_2._8_8_ + -0x18) + 8));
  if ((bVar1 & 1) == 0) {
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),
                          (string *)(word.field_2._M_local_buf + 8));
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) {
        std::fstream::close();
        path_local._4_4_ = 0;
        break;
      }
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&cit,(string *)(word.field_2._M_local_buf + 8),_Var3);
      std::operator>>((istream *)&cit,(string *)local_268);
      local_410._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&going_config_keyword_map_abi_cxx11_,(key_type *)local_268);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::_Rb_tree_const_iterator(&local_408,&local_410);
      local_420._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(&going_config_keyword_map_abi_cxx11_);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::_Rb_tree_const_iterator(&local_418,&local_420);
      bVar2 = std::operator==(&local_408,&local_418);
      if (bVar2) {
        printf("can\'t find keyword.\n");
        std::fstream::close();
        path_local._4_4_ = -1;
        bVar2 = true;
      }
      else {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator->(&local_408);
        if (ppVar5->second == 1) {
          std::operator>>((istream *)&cit,(string *)&going_docroot_abi_cxx11_);
        }
        else {
          if (ppVar5->second != 2) {
            std::fstream::close();
            path_local._4_4_ = -1;
            bVar2 = true;
            goto LAB_0010c7d3;
          }
          std::operator>>((istream *)&cit,(string *)&going_domain_abi_cxx11_);
        }
        bVar2 = false;
      }
LAB_0010c7d3:
      std::__cxx11::stringstream::~stringstream((stringstream *)&cit);
    } while (!bVar2);
  }
  else {
    printf("%s can\'t open\n",path);
    std::fstream::close();
    path_local._4_4_ = -1;
  }
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)(word.field_2._M_local_buf + 8));
  std::fstream::~fstream((void *)((long)&line.field_2 + 8));
  return path_local._4_4_;
}

Assistant:

int going_parse_config(const char *path)
{
	going_init_config_keyword_map();
	fstream infile(path, fstream::in);
	string line, word;
	if(!infile){
		printf("%s can't open\n", path);
		infile.close();
		return -1;
	}
	while(getline(infile, line))
	{
		stringstream stream(line);
		stream >> word;//keyword
		map<string, int>::const_iterator cit = going_config_keyword_map.find(word);
		if(cit == going_config_keyword_map.end()){
			printf("can't find keyword.\n");
			infile.close();
			return -1;
		}
		switch(cit -> second){
			case GOING_DOCROOT:
				stream >> going_docroot;
				break;
			case GOING_DOMAIN:
				stream >> going_domain;
				break;
			default:
				infile.close();
				return -1;
		}
	}
	infile.close();
	return 0;
}